

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.h
# Opt level: O2

string * __thiscall Address::getAddress_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  short sVar1;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  sVar1 = *(short *)(this->addr + 4);
  std::__cxx11::to_string(&local_38,*(int *)this->addr);
  std::operator+(&local_58,&local_38,":");
  std::__cxx11::to_string(&sStack_78,(int)sVar1);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string getAddress() {
		int id = 0;
		short port;
		memcpy(&id, &addr[0], sizeof(int));
		memcpy(&port, &addr[4], sizeof(short));
		return to_string(id) + ":" + to_string(port);
	}